

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::char_writer::operator()
          (char_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  value_type *pvVar1;
  undefined1 *in_RDI;
  undefined3 in_stack_ffffffffffffffcc;
  int iVar2;
  value_type vVar3;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *in_stack_ffffffffffffffd0;
  
  iVar2 = CONCAT13(*in_RDI,in_stack_ffffffffffffffcc);
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++
            (in_stack_ffffffffffffffd0,iVar2);
  vVar3 = (value_type)((uint)iVar2 >> 0x18);
  pvVar1 = truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator*
                     ((truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)
                      &stack0xffffffffffffffd0);
  *pvVar1 = vVar3;
  return;
}

Assistant:

void operator()(It &&it) const { *it++ = value; }